

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pDepthTests.cpp
# Opt level: O3

int __thiscall deqp::gles3::Performance::DepthTests::init(DepthTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestContext *testCtx;
  RenderContext *renderCtx;
  int extraout_EAX;
  TestNode *pTVar2;
  TestNode *pTVar3;
  BaseCase *pBVar4;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  testCtx = pCVar1->m_testCtx;
  renderCtx = pCVar1->m_renderCtx;
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "cull_efficiency","Fragment cull efficiency");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"workload",
             "Workload");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"workload_texture",
             "Fragment shader with texture lookup workload");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FragmentTextureWorkloadCullCase_0215ad98;
  pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(200);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"workload_arithmetic",
             "Fragment shader with arithmetic workload");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215aec8;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(200);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"workload_arithmetic_discard",
             "Fragment shader that may discard with arithmetic workload");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215af48;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "occluder_discard","Discard");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"grid_256","Parts of occluder geometry discarded");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215afc8;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x100;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"grid_128","Parts of occluder geometry discarded");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215afc8;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x80;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"grid_64","Parts of occluder geometry discarded");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215afc8;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x40;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"grid_32","Parts of occluder geometry discarded");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215afc8;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x20;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"grid_16","Parts of occluder geometry discarded");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215afc8;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x10;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"grid_8","Parts of occluder geometry discarded");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215afc8;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 8;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"grid_4","Parts of occluder geometry discarded");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215afc8;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 4;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"grid_2","Parts of occluder geometry discarded");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215afc8;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 2;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"grid_1","Parts of occluder geometry discarded");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215afc8;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 1;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "partial_coverage","Partial Coverage");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"100","Occluder covering only part of occluded geometry");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b048;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3f800000;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"099","Occluder covering only part of occluded geometry");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b048;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3f7d70a4;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"095","Occluder covering only part of occluded geometry");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b048;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3f733333;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"090","Occluder covering only part of occluded geometry");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b048;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3f666666;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"080","Occluder covering only part of occluded geometry");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b048;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3f4ccccd;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"070","Occluder covering only part of occluded geometry");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b048;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3f333333;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"050","Occluder covering only part of occluded geometry");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b048;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3f000000;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"025","Occluder covering only part of occluded geometry");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b048;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3e800000;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"010","Occluder covering only part of occluded geometry");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b048;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3dcccccd;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"frag_depth",
             "Partial Coverage");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pBVar4 = (BaseCase *)operator_new(200);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"occluder_static",::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b0c8;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(200);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"occluder_dynamic",::glcts::fixed_sample_locations_values + 1)
  ;
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b148;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(200);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"occluded_static",::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b1c8;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(200);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"occluded_dynamic",::glcts::fixed_sample_locations_values + 1)
  ;
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b248;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"order",
             "Rendering order");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pBVar4 = (BaseCase *)operator_new(200);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"reversed","Back to front rendering order");
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b2c8;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "culled_pixel_cost","Fragment cull efficiency");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"gradient",
             "Gradients with small depth differences");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pBVar4 = (BaseCase *)operator_new(200);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"flat",::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b348;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"gradient_050",::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b3e0;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3f000000;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"gradient_010",::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b3e0;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3dcccccd;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"gradient_005",::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b3e0;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3d4ccccd;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"gradient_002",::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b3e0;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3ca3d70a;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd0);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"gradient_001",::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b3e0;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x3c23d70a;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "occluder_geometry","Occluders with varying geometry complexity");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"flat_uniform_grid_5",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 5;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"flat_uniform_grid_15",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0xf;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"flat_uniform_grid_25",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x19;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"flat_uniform_grid_50",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x32;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"flat_uniform_grid_100",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 100;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"flat_noisy_grid_5",::glcts::fixed_sample_locations_values + 1
            );
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 5;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0x3e4ccccd;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"flat_noisy_grid_15",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0xf;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0x3d888889;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"flat_noisy_grid_25",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x19;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0x3d23d70a;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"flat_noisy_grid_50",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x32;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0x3ca3d70a;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"flat_noisy_grid_100",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 100;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) = 0x3c23d70a;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"uneven_uniform_grid_5",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 5;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
       0x3e4ccccd00000000;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"uneven_uniform_grid_15",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0xf;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
       0x3e4ccccd00000000;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"uneven_uniform_grid_25",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x19;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
       0x3e4ccccd00000000;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"uneven_uniform_grid_50",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x32;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
       0x3e4ccccd00000000;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"uneven_uniform_grid_100",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 100;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
       0x3e4ccccd00000000;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"uneven_noisy_grid_5",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 5;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
       0x3e4ccccd3e4ccccd;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"uneven_noisy_grid_15",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0xf;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
       0x3e4ccccd3d888889;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"uneven_noisy_grid_25",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x19;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
       0x3e4ccccd3d23d70a;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"uneven_noisy_grid_50",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 0x32;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
       0x3e4ccccd3ca3d70a;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(0xd8);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"uneven_noisy_grid_100",
             ::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b460;
  *(undefined4 *)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode = 100;
  *(undefined8 *)((long)&pBVar4[1].super_TestCase.super_TestNode._vptr_TestNode + 4) =
       0x3e4ccccd3c23d70a;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"frag_depth",
             "Modifying gl_FragDepth");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  pBVar4 = (BaseCase *)operator_new(200);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"occluder_static",::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b4e0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(200);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"occluder_dynamic",::glcts::fixed_sample_locations_values + 1)
  ;
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b560;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(200);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"occluded_static",::glcts::fixed_sample_locations_values + 1);
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b5e0;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  pBVar4 = (BaseCase *)operator_new(200);
  Performance::anon_unknown_0::BaseCase::BaseCase
            (pBVar4,testCtx,renderCtx,"occluded_dynamic",::glcts::fixed_sample_locations_values + 1)
  ;
  (pBVar4->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__BaseCase_0215b660;
  tcu::TestNode::addChild(pTVar3,(TestNode *)pBVar4);
  return extraout_EAX;
}

Assistant:

void DepthTests::init (void)
{
	TestContext&			testCtx		= m_context.getTestContext();
	const RenderContext&	renderCtx	= m_context.getRenderContext();

	{
		tcu::TestCaseGroup* const cullEfficiencyGroup = new tcu::TestCaseGroup(m_testCtx, "cull_efficiency", "Fragment cull efficiency");

		addChild(cullEfficiencyGroup);

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "workload", "Workload");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new FragmentTextureWorkloadCullCase(			testCtx, renderCtx, "workload_texture",				"Fragment shader with texture lookup workload"));
			group->addChild(new FragmentArithmeticWorkloadCullCase(			testCtx, renderCtx, "workload_arithmetic",			"Fragment shader with arithmetic workload"));
			group->addChild(new FragmentDiscardArithmeticWorkloadCullCase(	testCtx, renderCtx, "workload_arithmetic_discard",	"Fragment shader that may discard with arithmetic workload"));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "occluder_discard", "Discard");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_256",	"Parts of occluder geometry discarded", 256));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_128",	"Parts of occluder geometry discarded", 128));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_64",	"Parts of occluder geometry discarded", 64));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_32",	"Parts of occluder geometry discarded", 32));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_16",	"Parts of occluder geometry discarded", 16));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_8",	"Parts of occluder geometry discarded", 8));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_4",	"Parts of occluder geometry discarded", 4));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_2",	"Parts of occluder geometry discarded", 2));
			group->addChild(new PartialOccluderDiscardCullCase(testCtx, renderCtx, "grid_1",	"Parts of occluder geometry discarded", 1));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "partial_coverage", "Partial Coverage");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "100", "Occluder covering only part of occluded geometry", 1.00f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "099", "Occluder covering only part of occluded geometry", 0.99f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "095", "Occluder covering only part of occluded geometry", 0.95f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "090", "Occluder covering only part of occluded geometry", 0.90f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "080", "Occluder covering only part of occluded geometry", 0.80f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "070", "Occluder covering only part of occluded geometry", 0.70f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "050", "Occluder covering only part of occluded geometry", 0.50f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "025", "Occluder covering only part of occluded geometry", 0.25f));
			group->addChild(new PartialOccluderCullCase(testCtx, renderCtx, "010", "Occluder covering only part of occluded geometry", 0.10f));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "frag_depth", "Partial Coverage");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new StaticOccluderFragDepthCullCase( testCtx, renderCtx, "occluder_static", ""));
			group->addChild(new DynamicOccluderFragDepthCullCase(testCtx, renderCtx, "occluder_dynamic", ""));
			group->addChild(new StaticOccludedFragDepthCullCase( testCtx, renderCtx, "occluded_static", ""));
			group->addChild(new DynamicOccludedFragDepthCullCase(testCtx, renderCtx, "occluded_dynamic", ""));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "order", "Rendering order");

			cullEfficiencyGroup->addChild(group);

			group->addChild(new ReversedDepthOrderCullCase(testCtx, renderCtx, "reversed", "Back to front rendering order"));
		}
	}

	{
		tcu::TestCaseGroup* const testCostGroup = new tcu::TestCaseGroup(m_testCtx, "culled_pixel_cost", "Fragment cull efficiency");

		addChild(testCostGroup);

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "gradient", "Gradients with small depth differences");

			testCostGroup->addChild(group);

			group->addChild(new BaseCostCase(testCtx, renderCtx, "flat", ""));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_050", "", 0.50f));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_010", "", 0.10f));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_005", "", 0.05f));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_002", "", 0.02f));
			group->addChild(new GradientCostCase(testCtx, renderCtx, "gradient_001", "", 0.01f));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "occluder_geometry", "Occluders with varying geometry complexity");

			testCostGroup->addChild(group);

			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_5",   "", 5,   0.0f, 0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_15",  "", 15,  0.0f, 0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_25",  "", 25,  0.0f, 0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_50",  "", 50,  0.0f, 0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_uniform_grid_100", "", 100, 0.0f, 0.0f));

			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_5",   "", 5,   1.0f/5.0f,   0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_15",  "", 15,  1.0f/15.0f,  0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_25",  "", 25,  1.0f/25.0f,  0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_50",  "", 50,  1.0f/50.0f,  0.0f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "flat_noisy_grid_100", "", 100, 1.0f/100.0f, 0.0f));

			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_5",   "", 5,   0.0f, 0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_15",  "", 15,  0.0f, 0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_25",  "", 25,  0.0f, 0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_50",  "", 50,  0.0f, 0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_uniform_grid_100", "", 100, 0.0f, 0.2f));

			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_5",   "", 5,   1.0f/5.0f,   0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_15",  "", 15,  1.0f/15.0f,  0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_25",  "", 25,  1.0f/25.0f,  0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_50",  "", 50,  1.0f/50.0f,  0.2f));
			group->addChild(new OccludingGeometryComplexityCostCase(testCtx, renderCtx, "uneven_noisy_grid_100", "", 100, 1.0f/100.0f, 0.2f));
		}

		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "frag_depth", "Modifying gl_FragDepth");

			testCostGroup->addChild(group);

			group->addChild(new OccluderStaticFragDepthCostCase( testCtx, renderCtx, "occluder_static", ""));
			group->addChild(new OccluderDynamicFragDepthCostCase(testCtx, renderCtx, "occluder_dynamic", ""));
			group->addChild(new OccludedStaticFragDepthCostCase( testCtx, renderCtx, "occluded_static", ""));
			group->addChild(new OccludedDynamicFragDepthCostCase(testCtx, renderCtx, "occluded_dynamic", ""));
		}
	}
}